

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall chrono::robosimian::ContactManager::Process(ContactManager *this,RoboSimian *robot)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar1;
  ContactManager *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Report contacts",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  this->m_num_contacts = 0;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0017d970;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)this;
  plVar1 = *(long **)(robot->m_system + 0x158);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(robot->m_system + 0x160);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0013f299:
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      goto LAB_0013f2af;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      goto LAB_0013f299;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  this_01->_M_use_count = this_01->_M_use_count + 1;
LAB_0013f2af:
  local_28 = this;
  local_20 = this_01;
  (**(code **)(*plVar1 + 0x220))(plVar1,&local_28);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  total actual contacts: ",0x19);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->m_num_contacts);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return;
}

Assistant:

void ContactManager::Process(RoboSimian* robot) {
    std::cout << "Report contacts" << std::endl;
    m_num_contacts = 0;
    std::shared_ptr<ContactManager> shared_this(this, [](ContactManager*) {});
    robot->GetSystem()->GetContactContainer()->ReportAllContacts(shared_this);
    std::cout << "  total actual contacts: " << m_num_contacts << std::endl << std::endl;
}